

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadTuple.h
# Opt level: O1

void __thiscall QuadTuple::QuadTuple(QuadTuple *this,string *o,string *n1,string *n2,string *r)

{
  (this->op)._M_dataplus._M_p = (pointer)&(this->op).field_2;
  (this->op)._M_string_length = 0;
  (this->op).field_2._M_local_buf[0] = '\0';
  (this->name1)._M_dataplus._M_p = (pointer)&(this->name1).field_2;
  (this->name1)._M_string_length = 0;
  (this->name1).field_2._M_local_buf[0] = '\0';
  (this->name2)._M_dataplus._M_p = (pointer)&(this->name2).field_2;
  (this->name2)._M_string_length = 0;
  (this->name2).field_2._M_local_buf[0] = '\0';
  (this->res)._M_dataplus._M_p = (pointer)&(this->res).field_2;
  (this->res)._M_string_length = 0;
  (this->res).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->name1);
  std::__cxx11::string::_M_assign((string *)&this->name2);
  std::__cxx11::string::_M_assign((string *)&this->res);
  return;
}

Assistant:

QuadTuple(string o,  string n1, string n2, string r) {
        op = o;
        name1 = n1;
        name2 = n2;
        res = r;

    }